

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O0

QList<QGraphicsItem_*> * __thiscall
QGraphicsSceneBspTreeIndex::items(QGraphicsSceneBspTreeIndex *this,SortOrder order)

{
  long lVar1;
  QGraphicsSceneBspTreeIndexPrivate *itemList_00;
  back_insert_iterator<QList<QGraphicsItem_*>_> __first;
  const_iterator __last;
  back_insert_iterator<QList<QGraphicsItem_*>_> __result;
  undefined4 in_EDX;
  QGraphicsSceneBspTreeIndexPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsSceneBspTreeIndexPrivate *d;
  QList<QGraphicsItem_*> *itemList;
  QGraphicsItem *null;
  QGraphicsSceneBspTreeIndexPrivate *this_00;
  back_insert_iterator<QList<QGraphicsItem_*>_> in_stack_ffffffffffffff98;
  const_iterator in_stack_ffffffffffffffa0;
  const_iterator in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffca;
  undefined1 in_stack_ffffffffffffffcb;
  SortOrder in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  itemList_00 = d_func((QGraphicsSceneBspTreeIndex *)0xa1f674);
  QGraphicsSceneBspTreeIndexPrivate::purgeRemovedItems(this_00);
  in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc & 0xffffff;
  *(undefined1 **)&this_00->super_QGraphicsSceneIndexPrivate = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this_00->super_QGraphicsSceneIndexPrivate).field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this_00->super_QGraphicsSceneIndexPrivate).field_0x10 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0xa1f6b2);
  QList<QGraphicsItem_*>::size(&itemList_00->indexedItems);
  QList<QGraphicsItem_*>::size(&itemList_00->unindexedItems);
  QList<QGraphicsItem_*>::reserve
            (in_stack_ffffffffffffff98.container,CONCAT44(in_EDX,in_stack_ffffffffffffffd8));
  QList<QGraphicsItem_*>::cbegin((QList<QGraphicsItem_*> *)in_RDI);
  QList<QGraphicsItem_*>::cend((QList<QGraphicsItem_*> *)in_RDI);
  std::back_inserter<QList<QGraphicsItem*>>((QList<QGraphicsItem_*> *)in_RDI);
  __first = std::
            remove_copy<QList<QGraphicsItem*>::const_iterator,std::back_insert_iterator<QList<QGraphicsItem*>>,QGraphicsItem*>
                      (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98
                       ,(QGraphicsItem **)in_RDI);
  __last = QList<QGraphicsItem_*>::cbegin((QList<QGraphicsItem_*> *)in_RDI);
  __result.container =
       (QList<QGraphicsItem_*> *)QList<QGraphicsItem_*>::cend((QList<QGraphicsItem_*> *)in_RDI);
  std::back_inserter<QList<QGraphicsItem*>>((QList<QGraphicsItem_*> *)in_RDI);
  std::
  remove_copy<QList<QGraphicsItem*>::const_iterator,std::back_insert_iterator<QList<QGraphicsItem*>>,QGraphicsItem*>
            ((const_iterator)__first.container,__last,__result,(QGraphicsItem **)in_RDI);
  QGraphicsSceneBspTreeIndexPrivate::sortItems
            ((QList<QGraphicsItem_*> *)itemList_00,in_stack_ffffffffffffffcc,
             (bool)in_stack_ffffffffffffffcb,(bool)in_stack_ffffffffffffffca);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QList<QGraphicsItem_*> *)in_RDI;
}

Assistant:

QList<QGraphicsItem *> QGraphicsSceneBspTreeIndex::items(Qt::SortOrder order) const
{
    Q_D(const QGraphicsSceneBspTreeIndex);
    const_cast<QGraphicsSceneBspTreeIndexPrivate*>(d)->purgeRemovedItems();
    QList<QGraphicsItem *> itemList;
    itemList.reserve(d->indexedItems.size() + d->unindexedItems.size());

    // Rebuild the list of items to avoid holes. ### We could also just
    // compress the item lists at this point.
    QGraphicsItem *null = nullptr; // work-around for (at least) MSVC 2012 emitting
                                   // warning C4100 for its own header <algorithm>
                                   // when passing nullptr directly to remove_copy:
    std::remove_copy(d->indexedItems.cbegin(), d->indexedItems.cend(),
                     std::back_inserter(itemList), null);
    std::remove_copy(d->unindexedItems.cbegin(), d->unindexedItems.cend(),
                     std::back_inserter(itemList), null);

    d->sortItems(&itemList, order, d->sortCacheEnabled);
    return itemList;
}